

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O2

bool NextMove(Situation *situation,MoveGenerate *generate,Movement *hash_move,int step)

{
  Movement (*paMVar1) [2];
  UINT8 UVar2;
  undefined2 uVar3;
  UINT8 UVar4;
  undefined1 uVar5;
  UINT32 UVar6;
  bool bVar7;
  int iVar8;
  undefined8 uVar9;
  Movement *pMVar10;
  
  switch(generate->state) {
  case 1:
    generate->state = 2;
    if ((hash_move->from == '\0') || (bVar7 = MovementsLegal(*hash_move,situation), !bVar7))
    goto switchD_00106e90_caseD_2;
    goto LAB_00106fce;
  case 2:
switchD_00106e90_caseD_2:
    GetAllCaptureMovements(situation,&generate->move_nums,generate->moves);
    CaptureValue(situation,&generate->move_nums,generate->moves);
    std::__sort<Movement*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
              (generate->moves,generate->moves + generate->move_nums,
               (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x106c80);
    generate->index = 0;
    generate->state = 3;
    iVar8 = 0;
    break;
  case 3:
    iVar8 = generate->index;
    break;
  case 4:
    goto switchD_00106e90_caseD_4;
  case 5:
    goto LAB_00106f97;
  case 6:
    goto switchD_00106e90_caseD_6;
  case 7:
    goto switchD_00106e90_caseD_7;
  default:
    return false;
  }
  if ((iVar8 < generate->move_nums) && (1 < generate->moves[iVar8].value)) {
    pMVar10 = generate->moves + iVar8;
    UVar2 = pMVar10->movec;
    uVar3 = *(undefined2 *)&pMVar10->field_0xa;
    (generate->next).catc = pMVar10->catc;
    (generate->next).movec = UVar2;
    *(undefined2 *)&(generate->next).field_0xa = uVar3;
    UVar2 = pMVar10->to;
    UVar4 = pMVar10->capture;
    uVar5 = pMVar10->field_0x3;
    UVar6 = pMVar10->value;
    (generate->next).from = pMVar10->from;
    (generate->next).to = UVar2;
    (generate->next).capture = UVar4;
    (generate->next).field_0x3 = uVar5;
    (generate->next).value = UVar6;
  }
  else {
switchD_00106e90_caseD_4:
    generate->state = 5;
    if (KillerTable[step][0].from != '\0') {
      pMVar10 = KillerTable[step];
      bVar7 = MovementsLegal(*pMVar10,situation);
      if (bVar7) {
        paMVar1 = KillerTable + step;
        UVar2 = ((Movement *)((long)paMVar1 + 0))->movec;
        uVar3 = *(undefined2 *)&((Movement *)((long)paMVar1 + 0))->field_0xa;
        (generate->next).catc = ((Movement *)((long)paMVar1 + 0))->catc;
        (generate->next).movec = UVar2;
        *(undefined2 *)&(generate->next).field_0xa = uVar3;
        uVar9._0_1_ = pMVar10->from;
        uVar9._1_1_ = pMVar10->to;
        uVar9._2_1_ = pMVar10->capture;
        uVar9._3_1_ = pMVar10->field_0x3;
        uVar9._4_4_ = pMVar10->value;
        goto LAB_00106fdb;
      }
    }
LAB_00106f97:
    generate->state = 6;
    if (KillerTable[step][1].from != '\0') {
      hash_move = KillerTable[step] + 1;
      bVar7 = MovementsLegal(*hash_move,situation);
      if (bVar7) {
LAB_00106fce:
        UVar2 = hash_move->movec;
        uVar3 = *(undefined2 *)&hash_move->field_0xa;
        (generate->next).catc = hash_move->catc;
        (generate->next).movec = UVar2;
        *(undefined2 *)&(generate->next).field_0xa = uVar3;
        uVar9._0_1_ = hash_move->from;
        uVar9._1_1_ = hash_move->to;
        uVar9._2_1_ = hash_move->capture;
        uVar9._3_1_ = hash_move->field_0x3;
        uVar9._4_4_ = hash_move->value;
LAB_00106fdb:
        (generate->next).from = (char)uVar9;
        (generate->next).to = (char)((ulong)uVar9 >> 8);
        (generate->next).capture = (char)((ulong)uVar9 >> 0x10);
        (generate->next).field_0x3 = (char)((ulong)uVar9 >> 0x18);
        (generate->next).value = (int)((ulong)uVar9 >> 0x20);
        return true;
      }
    }
switchD_00106e90_caseD_6:
    iVar8 = generate->move_nums;
    GetAllNotCaptureMovements(situation,&generate->move_nums,generate->moves);
    NoCaptureValue(situation,&generate->move_nums,generate->moves,iVar8);
    std::__sort<Movement*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
              (generate->moves + iVar8,generate->moves + generate->move_nums,
               (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x106c80);
    generate->state = 7;
switchD_00106e90_caseD_7:
    iVar8 = generate->index;
    if (generate->move_nums <= iVar8) {
      return false;
    }
    pMVar10 = generate->moves + iVar8;
    UVar2 = pMVar10->movec;
    uVar3 = *(undefined2 *)&pMVar10->field_0xa;
    (generate->next).catc = pMVar10->catc;
    (generate->next).movec = UVar2;
    *(undefined2 *)&(generate->next).field_0xa = uVar3;
    pMVar10 = generate->moves + iVar8;
    UVar2 = pMVar10->to;
    UVar4 = pMVar10->capture;
    uVar5 = pMVar10->field_0x3;
    UVar6 = pMVar10->value;
    (generate->next).from = pMVar10->from;
    (generate->next).to = UVar2;
    (generate->next).capture = UVar4;
    (generate->next).field_0x3 = uVar5;
    (generate->next).value = UVar6;
  }
  generate->index = iVar8 + 1;
  return true;
}

Assistant:

bool NextMove(const Situation& situation, MoveGenerate& generate, Movement& hash_move, int step){
    int flag;
    switch (generate.state)
    {
    case HASH_GET:
        generate.state = CAP_GEN;
        if(hash_move.from && MovementsLegal(hash_move, situation)){
            generate.next = hash_move;
            return true;
        }
    case CAP_GEN:   // 生成吃子着法
        GetAllCaptureMovements(situation, generate.move_nums, generate.moves);
        CaptureValue(situation, generate.move_nums, generate.moves);
        std::sort(generate.moves, generate.moves + generate.move_nums, cmp);

        generate.index = 0;
        generate.state = CAP_GET;
    case CAP_GET:
        if(generate.index < generate.move_nums && generate.moves[generate.index].value > 1){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    case KILL1_GET:
        generate.state = KILL2_GET;
        if(KillerTable[step][0].from && MovementsLegal(KillerTable[step][0], situation)){
            generate.next = KillerTable[step][0];
            return true;
        }
    case KILL2_GET:
        generate.state = NOCAP_GEN;
        if(KillerTable[step][1].from && MovementsLegal(KillerTable[step][1], situation)){
            generate.next = KillerTable[step][1];
            return true;
        }
    case NOCAP_GEN:
        flag = generate.move_nums;
        GetAllNotCaptureMovements(situation, generate.move_nums, generate.moves);
        NoCaptureValue(situation, generate.move_nums, generate.moves, flag);
        std::sort(generate.moves + flag, generate.moves + generate.move_nums, cmp);
    
        generate.state = NOCAP_GET;
    case NOCAP_GET:
        if(generate.index < generate.move_nums){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    default:
        return false;
    }
}